

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O1

void write_vector_vector<QPDF::HPageOffsetEntry>
               (BitWriter *w,int nitems1,
               vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *vec1,
               offset_in_HPageOffsetEntry_to_int nitems2,int bits,
               offset_in_HPageOffsetEntry_to_vector<int,_std::allocator<int>_> vec2)

{
  int iVar1;
  long lVar2;
  int i;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined4 in_register_00000084;
  pointer pHVar7;
  type ii;
  type ii_1;
  
  i = (int)nitems2;
  uVar5 = 0;
  while( true ) {
    if (nitems1 < 0) {
      QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(nitems1);
    }
    if (uVar5 == (long)nitems1) {
      BitWriter::flush(w);
      return;
    }
    pHVar7 = (vec1->
             super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar3 = ((long)(vec1->
                   super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar7 >> 3) *
            0x2e8ba2e8ba2e8ba3;
    uVar6 = uVar5;
    if (uVar3 < uVar5 || uVar3 - uVar5 == 0) break;
    uVar3 = 0;
    while( true ) {
      if (pHVar7[uVar5].nshared_objects < 0) {
        QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(pHVar7[uVar5].nshared_objects);
      }
      if ((ulong)(long)pHVar7[uVar5].nshared_objects <= uVar3) break;
      pHVar7 = (vec1->
               super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar4 = ((long)(vec1->
                     super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar7 >> 3) *
              0x2e8ba2e8ba2e8ba3;
      uVar6 = uVar5;
      if ((uVar4 < uVar5 || uVar4 - uVar5 == 0) ||
         (lVar2 = *(long *)((long)&pHVar7[uVar5].delta_nobjects +
                           CONCAT44(in_register_00000084,bits)), uVar6 = uVar3,
         (ulong)(*(long *)((long)&pHVar7[uVar5].delta_page_length +
                          CONCAT44(in_register_00000084,bits)) - lVar2 >> 2) <= uVar3))
      goto LAB_0021dc85;
      iVar1 = *(int *)(lVar2 + uVar3 * 4);
      if (iVar1 < 0) {
        QIntC::IntConverter<int,_unsigned_long_long,_true,_false>::error(iVar1);
      }
      iVar1 = *(int *)(lVar2 + uVar3 * 4);
      if (i < 0) {
        QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(i);
      }
      BitWriter::writeBits(w,(long)iVar1,(long)i);
      uVar3 = uVar3 + 1;
      pHVar7 = (vec1->
               super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar4 = ((long)(vec1->
                     super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar7 >> 3) *
              0x2e8ba2e8ba2e8ba3;
      uVar6 = uVar5;
      if (uVar4 < uVar5 || uVar4 - uVar5 == 0) goto LAB_0021dc85;
    }
    uVar5 = uVar5 + 1;
  }
LAB_0021dc85:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6);
}

Assistant:

static void
write_vector_vector(
    BitWriter& w,
    int nitems1,
    std::vector<T>& vec1,
    int T::* nitems2,
    int bits,
    std::vector<int> T::* vec2)
{
    // nitems1 times, write nitems2 (from the ith element of vec1) items from the vec2 vector field
    // of the ith item of vec1.
    for (size_t i1 = 0; i1 < QIntC::to_size(nitems1); ++i1) {
        for (size_t i2 = 0; i2 < QIntC::to_size(vec1.at(i1).*nitems2); ++i2) {
            w.writeBits(QIntC::to_ulonglong((vec1.at(i1).*vec2).at(i2)), QIntC::to_size(bits));
        }
    }
    w.flush();
}